

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O2

void __thiscall
twitter::zipkin::thrift::BinaryAnnotation::BinaryAnnotation
          (BinaryAnnotation *this,BinaryAnnotation *other5)

{
  *(undefined ***)this = &PTR__BinaryAnnotation_0029b8f0;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  Endpoint::Endpoint(&this->host);
  this->__isset = (_BinaryAnnotation__isset)((byte)this->__isset & 0xf0);
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->value);
  this->annotation_type = other5->annotation_type;
  Endpoint::operator=(&this->host,&other5->host);
  this->__isset = other5->__isset;
  return;
}

Assistant:

BinaryAnnotation::BinaryAnnotation(const BinaryAnnotation& other5) {
  key = other5.key;
  value = other5.value;
  annotation_type = other5.annotation_type;
  host = other5.host;
  __isset = other5.__isset;
}